

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O0

void __thiscall
Js::FunctionWithHomeObj<Js::ScriptFunction>::MarshalCrossSite_TTDInflate
          (FunctionWithHomeObj<Js::ScriptFunction> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionWithHomeObj<Js::ScriptFunction> *this_local;
  
  bVar2 = VirtualTableInfo<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x36,
                                "(VirtualTableInfo<FunctionWithHomeObj<BaseClass>>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  VirtualTableInfo<Js::CrossSiteObject<Js::FunctionWithHomeObj<Js::ScriptFunction>_>_>::
  SetVirtualTable(this);
  return;
}

Assistant:

FunctionWithHomeObj(FunctionProxy* proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), homeObj(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasHomeObj());
        }